

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileHandle::EraseBlockIndex(TemporaryFileHandle *this,block_id_t block_index)

{
  lock_guard<std::mutex> in_RAX;
  unsigned_long index;
  mutex *mutex;
  TemporaryFileLock lock;
  TemporaryFileLock local_18;
  
  mutex = &this->file_lock;
  local_18.lock._M_device = (lock_guard<std::mutex>)(lock_guard<std::mutex>)in_RAX._M_device;
  TemporaryFileLock::TemporaryFileLock(&local_18,mutex);
  index = NumericCastImpl<unsigned_long,_long,_false>::Convert(block_index);
  RemoveTempBlockIndex(this,(TemporaryFileLock *)mutex,index);
  pthread_mutex_unlock((pthread_mutex_t *)local_18.lock._M_device);
  return;
}

Assistant:

void TemporaryFileHandle::EraseBlockIndex(block_id_t block_index) {
	// remove the block (and potentially truncate the temp file)
	TemporaryFileLock lock(file_lock);
	D_ASSERT(handle);
	RemoveTempBlockIndex(lock, NumericCast<idx_t>(block_index));
}